

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_STL_utils.cpp
# Opt level: O0

void __thiscall
amrex::STLtools::read_binary_stl_file
          (STLtools *this,string *fname,Real scale,Array<Real,_3> *center,int reverse_normal)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  _Ios_Openmode _Var4;
  const_reference pvVar5;
  Triangle *pTVar6;
  int in_ECX;
  string *in_RSI;
  PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_> *in_RDI;
  double in_XMM0_Qa;
  int j;
  Real *p;
  int i;
  uint32_t numtris;
  char tmp [81];
  ifstream is;
  RealDescriptor real32_descr;
  IntDescriptor uint16_descr;
  IntDescriptor uint32_descr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff928;
  Print *in_stack_fffffffffffff930;
  IntDescriptor *in_stack_fffffffffffff938;
  Real RVar7;
  PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_>
  *in_stack_fffffffffffff940;
  double dVar8;
  size_t in_stack_fffffffffffff948;
  uint *in_stack_fffffffffffff950;
  ostream *in_stack_fffffffffffff958;
  Print *in_stack_fffffffffffff960;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff970;
  RealDescriptor *in_stack_fffffffffffff978;
  undefined7 in_stack_fffffffffffff980;
  undefined1 in_stack_fffffffffffff987;
  Ordering o;
  _Ios_Openmode __b;
  RealDescriptor *in_stack_fffffffffffff990;
  string *out;
  Print *in_stack_fffffffffffff9a0;
  int local_63c;
  Triangle *local_638;
  int local_62c;
  undefined4 local_49c;
  undefined1 local_498 [80];
  undefined1 local_448;
  string local_438 [32];
  char local_418 [568];
  IntDescriptor local_1e0;
  IntDescriptor local_1d0 [26];
  int local_24;
  double local_18;
  string *local_10;
  
  local_24 = in_ECX;
  local_18 = in_XMM0_Qa;
  local_10 = in_RSI;
  bVar1 = ParallelDescriptor::IOProcessor();
  if (bVar1) {
    iVar3 = Verbose();
    if (iVar3 != 0) {
      OutStream();
      Print::Print(in_stack_fffffffffffff960,in_stack_fffffffffffff958);
      Print::operator<<(in_stack_fffffffffffff930,(char (*) [25])in_stack_fffffffffffff928);
      in_stack_fffffffffffff9a0 =
           Print::operator<<(in_stack_fffffffffffff930,in_stack_fffffffffffff928);
      Print::operator<<(in_stack_fffffffffffff930,(char (*) [2])in_stack_fffffffffffff928);
      Print::~Print(in_stack_fffffffffffff9a0);
    }
    o = ReverseOrder;
    IntDescriptor::IntDescriptor(local_1d0,4,ReverseOrder);
    IntDescriptor::IntDescriptor(&local_1e0,2,o);
    __b = _S_bin;
    RealDescriptor::RealDescriptor
              (in_stack_fffffffffffff990,(Long *)CONCAT44(4,o),
               (int *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980),
               (int)((ulong)in_stack_fffffffffffff978 >> 0x20));
    _Var4 = std::operator|(_S_in,__b);
    std::ifstream::ifstream(local_418,local_10,_Var4);
    bVar2 = std::ios::good();
    out = local_10;
    if ((bVar2 & 1) == 0) {
      std::operator+((char *)in_stack_fffffffffffff978,in_stack_fffffffffffff970);
      Abort(in_stack_fffffffffffff928);
      std::__cxx11::string::~string(local_438);
      out = local_10;
    }
    local_448 = 0;
    std::istream::read(local_418,(long)local_498);
    readIntData<unsigned_int,unsigned_int>
              (in_stack_fffffffffffff950,in_stack_fffffffffffff948,
               (istream *)in_stack_fffffffffffff940,in_stack_fffffffffffff938);
    *(undefined4 *)&in_RDI[3].m_data = local_49c;
    PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_>::resize
              (in_stack_fffffffffffff940,(size_type)in_stack_fffffffffffff938);
    iVar3 = Verbose();
    if (iVar3 != 0) {
      in_stack_fffffffffffff978 = (RealDescriptor *)OutStream();
      Print::Print(in_stack_fffffffffffff960,in_stack_fffffffffffff958);
      Print::operator<<(in_stack_fffffffffffff930,(char (*) [26])in_stack_fffffffffffff928);
      Print::operator<<(in_stack_fffffffffffff930,(int *)in_stack_fffffffffffff928);
      Print::operator<<(in_stack_fffffffffffff930,(char (*) [2])in_stack_fffffffffffff928);
      Print::~Print(in_stack_fffffffffffff9a0);
    }
    for (local_62c = 0; local_62c < *(int *)&in_RDI[3].m_data; local_62c = local_62c + 1) {
      std::istream::read(local_418,(long)local_498);
      local_638 = PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_>::
                  operator[](in_RDI,(long)local_62c);
      RealDescriptor::convertToNativeFormat
                ((Real *)out,CONCAT44(__b,o),(void *)CONCAT17(bVar2,in_stack_fffffffffffff980),
                 in_stack_fffffffffffff978);
      for (local_63c = 0; local_63c < 3; local_63c = local_63c + 1) {
        RVar7 = (local_638->v1).x;
        dVar8 = local_18;
        pvVar5 = std::array<double,_3UL>::operator[]
                           ((array<double,_3UL> *)in_stack_fffffffffffff930,
                            (size_type)in_stack_fffffffffffff928);
        (local_638->v1).x = RVar7 * dVar8 + *pvVar5;
        RVar7 = (local_638->v1).y;
        dVar8 = local_18;
        pvVar5 = std::array<double,_3UL>::operator[]
                           ((array<double,_3UL> *)in_stack_fffffffffffff930,
                            (size_type)in_stack_fffffffffffff928);
        (local_638->v1).y = RVar7 * dVar8 + *pvVar5;
        RVar7 = (local_638->v1).z;
        dVar8 = local_18;
        pvVar5 = std::array<double,_3UL>::operator[]
                           ((array<double,_3UL> *)in_stack_fffffffffffff930,
                            (size_type)in_stack_fffffffffffff928);
        (local_638->v1).z = RVar7 * dVar8 + *pvVar5;
        local_638 = (Triangle *)&local_638->v2;
      }
      if (local_24 != 0) {
        in_stack_fffffffffffff930 =
             (Print *)PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_>
                      ::operator[](in_RDI,(long)local_62c);
        pTVar6 = PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_>::
                 operator[](in_RDI,(long)local_62c);
        std::swap<amrex::XDim3>((XDim3 *)in_stack_fffffffffffff930,&pTVar6->v2);
      }
    }
    std::ifstream::~ifstream(local_418);
    RealDescriptor::~RealDescriptor((RealDescriptor *)in_stack_fffffffffffff930);
  }
  return;
}

Assistant:

void
STLtools::read_binary_stl_file (std::string const& fname, Real scale,
                                Array<Real,3> const& center, int reverse_normal)
{
    if (ParallelDescriptor::IOProcessor()) {
        if (amrex::Verbose()) {
            Print() << "Reading binary STL file "<< fname << "\n";
        }

        IntDescriptor uint32_descr(sizeof(uint32_t), IntDescriptor::ReverseOrder);
        IntDescriptor uint16_descr(sizeof(uint16_t), IntDescriptor::ReverseOrder);
        RealDescriptor real32_descr(FPC::ieee_float, FPC::reverse_float_order, 4);

        std::ifstream is(fname, std::istringstream::in|std::ios::binary);
        if (!is.good()) {
            amrex::Abort("STLtools::read_binary_stl_file: failed to open " + fname);
        }

        char tmp[81];
        tmp[80] = '\0';
        is.read(tmp, 80); // Header - 80 bytes

        uint32_t numtris; // uint32 - Number of triangles - 4 bytes
        amrex::readIntData<uint32_t,uint32_t>(&numtris, 1, is, uint32_descr);
        m_num_tri = static_cast<int>(numtris);
        m_tri_pts_h.resize(m_num_tri);

        if (amrex::Verbose()) {
            Print() << "    Number of triangles: " << m_num_tri << "\n";
        }

        for (int i=0; i < m_num_tri; ++i) {
            is.read(tmp, 50);  // 50 bytes for each triangle. Vertex 1 starts at 12 bytes.
            Real* p = &(m_tri_pts_h[i].v1.x);
            RealDescriptor::convertToNativeFormat(p, 9, tmp+12, real32_descr);
            for (int j = 0; j < 3; ++j) {
                p[0] = p[0] * scale + center[0];
                p[1] = p[1] * scale + center[1];
                p[2] = p[2] * scale + center[2];
                p += 3;
            }
            if (reverse_normal) {
                std::swap(m_tri_pts_h[i].v1, m_tri_pts_h[i].v2);
            }
        }
    }
}